

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Prefs.cxx
# Opt level: O1

void __thiscall Fl_Tree_Prefs::openicon(Fl_Tree_Prefs *this,Fl_Image *val)

{
  Fl_Pixmap *pFVar1;
  
  pFVar1 = &L_openpixmap;
  if (val != (Fl_Image *)0x0) {
    pFVar1 = (Fl_Pixmap *)val;
  }
  this->_openimage = &pFVar1->super_Fl_Image;
  return;
}

Assistant:

void Fl_Tree_Prefs::openicon(Fl_Image *val) {
  _openimage = val ? val : &L_openpixmap;
#if FLTK_ABI_VERSION >= 10304
  // Update deactivated version of icon..
  if ( _opendeimage ) delete _opendeimage;
  if ( _openimage ) {
    _opendeimage = _openimage->copy();
    _opendeimage->inactive();
  } else {
    _opendeimage = 0;
  }
#endif
}